

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

int hydro_hash_final(hydro_hash_state *state,uint8_t *out,size_t out_len)

{
  uint8_t *state_u8;
  ulong in_RDX;
  void *in_RSI;
  hydro_hash_state *in_RDI;
  size_t leftover;
  size_t lc_len;
  size_t i;
  uint8_t *buf;
  uint8_t lc [4];
  undefined8 in_stack_ffffffffffffffb8;
  ulong local_38;
  hydro_hash_state *phVar1;
  int local_4;
  
  if ((in_RDX < 0x10) || (0xffff < in_RDX)) {
    local_4 = -1;
  }
  else {
    state_u8 = (uint8_t *)(long)(int)(((char)(in_RDX >> 8) != '\0') + 1);
    phVar1 = in_RDI;
    hydro_hash_update(in_RDI,in_RSI,in_RDX);
    gimli_pad_u8((uint8_t *)in_RDI,(ulong)phVar1->buf_off,'\x0f');
    for (local_38 = 0; local_38 < in_RDX >> 4; local_38 = local_38 + 1) {
      gimli_core_u8(state_u8,(uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38));
      *(undefined8 *)((long)in_RSI + local_38 * 0x10) = *(undefined8 *)in_RDI->state;
      *(undefined8 *)((long)in_RSI + local_38 * 0x10 + 8) = *(undefined8 *)(in_RDI->state + 2);
    }
    if ((in_RDX & 0xf) != 0) {
      gimli_core_u8(state_u8,'\0');
      mem_cpy((void *)((long)in_RSI + local_38 * 0x10),in_RDI,in_RDX & 0xf);
    }
    phVar1->buf_off = '\x10';
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
hydro_hash_final(hydro_hash_state *state, uint8_t *out, size_t out_len)
{
    uint8_t  lc[4];
    uint8_t *buf = (uint8_t *) (void *) state->state;
    size_t   i;
    size_t   lc_len;
    size_t   leftover;

    if (out_len < hydro_hash_BYTES_MIN || out_len > hydro_hash_BYTES_MAX) {
        return -1;
    }
    COMPILER_ASSERT(hydro_hash_BYTES_MAX <= 0xffff);
    lc[1]  = (uint8_t) out_len;
    lc[2]  = (uint8_t) (out_len >> 8);
    lc[3]  = 0;
    lc_len = (size_t) (1 + (lc[2] != 0));
    lc[0]  = (uint8_t) lc_len;
    hydro_hash_update(state, lc, 1 + lc_len + 1);
    gimli_pad_u8(buf, state->buf_off, gimli_DOMAIN_XOF);
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(buf, 0);
        memcpy(out + i * gimli_RATE, buf, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(buf, 0);
        mem_cpy(out + i * gimli_RATE, buf, leftover);
    }
    state->buf_off = gimli_RATE;

    return 0;
}